

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertialParametersSolidShapesHelpers.cpp
# Opt level: O2

iDynTree * __thiscall
iDynTree::boxGet6DInertiaInLinkFrameFromDensity(iDynTree *this,Box *box,double density)

{
  SpatialInertia *pSVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Position comInGeomFrame;
  RotationalInertia rotInertiaInGeomFrame;
  SpatialInertia inertiaInGeometryFrame;
  Position local_f0 [24];
  double local_d8 [4];
  double local_b8;
  double local_98;
  SpatialInertia local_90 [104];
  
  dVar2 = (double)iDynTree::Box::getX();
  dVar3 = (double)iDynTree::Box::getY();
  dVar4 = (double)iDynTree::Box::getZ();
  dVar2 = dVar4 * dVar3 * dVar2 * density;
  iDynTree::Position::Position(local_f0);
  VectorFixSize<3U>::zero((VectorFixSize<3U> *)local_f0);
  iDynTree::RotationalInertia::RotationalInertia((RotationalInertia *)local_d8);
  MatrixFixSize<3U,_3U>::zero((MatrixFixSize<3U,_3U> *)local_d8);
  dVar3 = (double)iDynTree::Box::getX();
  dVar4 = (double)iDynTree::Box::getX();
  dVar5 = (double)iDynTree::Box::getY();
  dVar6 = (double)iDynTree::Box::getY();
  dVar7 = (double)iDynTree::Box::getZ();
  dVar8 = (double)iDynTree::Box::getZ();
  local_98 = dVar2 / 12.0;
  local_d8[0] = (dVar6 * dVar5 + dVar8 * dVar7) * local_98;
  local_b8 = (dVar8 * dVar7 + dVar4 * dVar3) * local_98;
  local_98 = (dVar6 * dVar5 + dVar4 * dVar3) * local_98;
  iDynTree::SpatialInertia::SpatialInertia(local_90,dVar2,local_f0,(RotationalInertia *)local_d8);
  pSVar1 = (SpatialInertia *)iDynTree::SolidShape::getLink_H_geometry();
  iDynTree::Transform::operator*((Transform *)this,pSVar1);
  return this;
}

Assistant:

SpatialInertia boxGet6DInertiaInLinkFrameFromDensity(const Box& box,
                                                     double density)
{
    double boxVolume = box.getX() * box.getY() * box.getZ();
    double boxMass   = density*boxVolume;
    // Assuming uniform density, the center of mass is coincident with the box center
    Position comInGeomFrame;
    comInGeomFrame.zero();
    // From http://scienceworld.wolfram.com/physics/MomentofInertiaRectangularParallelepiped.html
    RotationalInertia rotInertiaInGeomFrame;
    rotInertiaInGeomFrame.zero();
    double x2 = box.getX() * box.getX();
    double y2 = box.getY() * box.getY();
    double z2 = box.getZ() * box.getZ();
    rotInertiaInGeomFrame(0, 0) = (boxMass/12.0)*(y2+z2);
    rotInertiaInGeomFrame(1, 1) = (boxMass/12.0)*(x2+z2);
    rotInertiaInGeomFrame(2, 2) = (boxMass/12.0)*(x2+y2);

    SpatialInertia inertiaInGeometryFrame = SpatialInertia(boxMass, comInGeomFrame, rotInertiaInGeomFrame);

    return box.getLink_H_geometry() * inertiaInGeometryFrame;
}